

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cc
# Opt level: O1

StringPiece re2::EngineName(Engine e)

{
  char *__s;
  size_t sVar1;
  StringPiece SVar2;
  LogMessage local_190;
  
  if ((int)e < 0) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2c,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Check failed: (e) >= (0)",0x18);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (9 < (int)e) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2d,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,
               "Check failed: (e) < ((int)(sizeof(engine_names)/sizeof((engine_names)[0])))",0x4b);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  if (*(long *)(engine_names + (ulong)e * 8) == 0) {
    LogMessage::LogMessage
              (&local_190,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/tester.cc"
               ,0x2e,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_190.str_,"Check failed: engine_names[e] != NULL",0x25);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_190);
  }
  __s = *(char **)(engine_names + (ulong)e * 8);
  if (__s == (char *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = strlen(__s);
  }
  SVar2._8_8_ = sVar1;
  SVar2.ptr_ = __s;
  return SVar2;
}

Assistant:

static StringPiece EngineName(Engine e) {
  CHECK_GE(e, 0);
  CHECK_LT(e, arraysize(engine_names));
  CHECK(engine_names[e] != NULL);
  return engine_names[e];
}